

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.h
# Opt level: O0

void __thiscall
dg::NodesSeq<dg::dda::RWNode>::NodesSeq
          (NodesSeq<dg::dda::RWNode> *this,initializer_list<dg::dda::RWNode_*> *lst)

{
  size_type sVar1;
  const_iterator ppRVar2;
  initializer_list<dg::dda::RWNode_*> *in_RSI;
  initializer_list<dg::dda::RWNode_*> *in_RDI;
  RWNode **unaff_retaddr;
  RWNode **in_stack_00000008;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_stack_00000010;
  const_iterator in_stack_00000018;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_stack_ffffffffffffffc8;
  
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::vector
            ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)0x18ed4d);
  in_RDI[1]._M_len = 0;
  sVar1 = std::initializer_list<dg::dda::RWNode_*>::size(in_RSI);
  if (sVar1 != 0) {
    std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
              (in_stack_ffffffffffffffc8);
    __gnu_cxx::
    __normal_iterator<dg::dda::RWNode*const*,std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
    ::__normal_iterator<dg::dda::RWNode**>
              ((__normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                *)in_RDI,
               (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                *)in_stack_ffffffffffffffc8);
    std::initializer_list<dg::dda::RWNode_*>::begin(in_RSI);
    std::initializer_list<dg::dda::RWNode_*>::end(in_RDI);
    std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
    insert<dg::dda::RWNode*const*,void>
              (in_stack_00000010,in_stack_00000018,in_stack_00000008,unaff_retaddr);
    ppRVar2 = std::initializer_list<dg::dda::RWNode_*>::begin(in_RSI);
    in_RDI[1]._M_len = (size_type)*ppRVar2;
  }
  return;
}

Assistant:

NodesSeq(const std::initializer_list<NodeT *> &lst) {
        if (lst.size() > 0) {
            nodes.insert(nodes.end(), lst.begin(), lst.end());
            representant = *lst.begin();
        }
    }